

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::ReadBlocks
          (BamToolsIndex *this,BtiReferenceSummary *refSummary,BtiBlockVector *blocks)

{
  pointer pBVar1;
  int i;
  int iVar2;
  BtiBlock block;
  BtiBlock local_40;
  
  pBVar1 = (blocks->
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((blocks->
      super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
      )._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
    (blocks->
    super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::reserve
            (blocks,(long)refSummary->NumBlocks);
  local_40._0_8_ = refSummary->FirstBlockFilePosition;
  Seek(this,(int64_t *)&local_40,0);
  local_40._0_8_ = local_40._0_8_ & 0xffffffff00000000;
  local_40.StartOffset = 0;
  local_40.StartPosition = 0;
  for (iVar2 = 0; iVar2 < refSummary->NumBlocks; iVar2 = iVar2 + 1) {
    ReadBlock(this,&local_40);
    std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
    push_back(blocks,&local_40);
  }
  return;
}

Assistant:

void BamToolsIndex::ReadBlocks(const BtiReferenceSummary& refSummary, BtiBlockVector& blocks)
{

    // prep blocks container
    blocks.clear();
    blocks.reserve(refSummary.NumBlocks);

    // skip to first block entry
    Seek(refSummary.FirstBlockFilePosition, SEEK_SET);

    // read & store block entries
    BtiBlock block;
    for (int i = 0; i < refSummary.NumBlocks; ++i) {
        ReadBlock(block);
        blocks.push_back(block);
    }
}